

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O0

void test_run_at_func(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      t1,int ms)

{
  bool bVar1;
  log_level lVar2;
  longlong lVar3;
  Logger *pLVar4;
  rep_conflict rVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<double,_std::ratio<1L,_1000L>_> local_40;
  int local_34;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_30;
  int tm_diff;
  time_point t2;
  longlong tid;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_10;
  int ms_local;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1_local;
  
  tStack_10.__d.__r = t1.__d.__r;
  t2.__d.__r = (duration)std::this_thread::get_id();
  lVar3 = tid_to_ll((id *)&t2);
  tStack_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_48.__r = (rep)std::chrono::operator-(&stack0xffffffffffffffd0,&stack0xfffffffffffffff0);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_40,&local_48);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_40);
  local_34 = (int)rVar5;
  pLVar4 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar4);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","test_run_at_func",0x1a);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar4 = Logger::get_instance();
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/timer/tests/test_timer.cpp"
                      ,"test_run_at_func",0x1a,LOG_LEVEL_INFO,
                      "[tid:%lld] hello, run_at_func ! run at %d ms, time diff is %d ms\n",lVar3,ms,
                      local_34);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  return;
}

Assistant:

void test_run_at_func(chrono::time_point<chrono::steady_clock> t1, int ms)
{
    long long tid = tid_to_ll(this_thread::get_id());

    auto t2 = chrono::steady_clock::now();
    int tm_diff = static_cast<int>( chrono::duration<double, milli>(t2-t1).count() );
    LOG_INFO("[tid:%lld] hello, run_at_func ! run at %d ms, time diff is %d ms\n", tid, ms, tm_diff);   
}